

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdDecomposeLevel
              (word *pTruth,int nVarsInit,int fSplitPrime,int fWriteTruth,char *pRes,int *pVarLevels
              )

{
  char *p_00;
  char cVar1;
  int iVar2;
  Dau_Dsd_t *p;
  uint uVar3;
  ulong uVar4;
  Dau_Dsd_t P;
  Dau_Dsd_t DStack_d18;
  
  DStack_d18.nSizeNonDec = 0;
  if ((*pTruth & 1) == 0) {
    uVar3 = 1 << ((char)nVarsInit - 6U & 0x1f);
    if (nVarsInit < 7) {
      uVar3 = 1;
    }
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        if (pTruth[uVar4] != 0) {
          if ((*pTruth & 1) != 0) goto LAB_00506fc0;
          goto LAB_00506f65;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    cVar1 = '0';
  }
  else {
LAB_00506fc0:
    uVar3 = 1 << ((char)nVarsInit - 6U & 0x1f);
    if (nVarsInit < 7) {
      uVar3 = 1;
    }
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        if (pTruth[uVar4] != 0xffffffffffffffff) {
LAB_00506f65:
          DStack_d18.fSplitPrime = fSplitPrime;
          DStack_d18.fWriteTruth = fWriteTruth;
          DStack_d18.pVarLevels = pVarLevels;
          iVar2 = Dau_DsdDecomposeInt(&DStack_d18,pTruth,nVarsInit);
          p_00 = DStack_d18.pOutput;
          Dau_DsdComputeMatches(p_00);
          Dau_DsdRemoveBraces(p_00,Dau_DsdComputeMatches::pMatches);
          if (pRes != (char *)0x0) {
            strcpy(pRes,p_00);
          }
          if (iVar2 != 1 || fSplitPrime != 0) {
            if (fSplitPrime == 0 || iVar2 != 2) {
              return DStack_d18.nSizeNonDec;
            }
            return -1;
          }
          __assert_fail("fSplitPrime || Status != 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                        ,0x7a1,"int Dau_DsdDecomposeLevel(word *, int, int, int, char *, int *)");
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    cVar1 = '1';
  }
  if (pRes != (char *)0x0) {
    *pRes = cVar1;
    pRes[1] = '\0';
  }
  return 0;
}

Assistant:

int Dau_DsdDecomposeLevel( word * pTruth, int nVarsInit, int fSplitPrime, int fWriteTruth, char * pRes, int * pVarLevels )
{
    Dau_Dsd_t P, * p = &P;
    p->fSplitPrime = fSplitPrime;
    p->fWriteTruth = fWriteTruth;
    p->pVarLevels  = pVarLevels;
    p->nSizeNonDec = 0;
    if ( (pTruth[0] & 1) == 0 && Abc_TtIsConst0(pTruth, Abc_TtWordNum(nVarsInit)) )
        { if ( pRes ) pRes[0] = '0', pRes[1] = 0; }
    else if ( (pTruth[0] & 1) && Abc_TtIsConst1(pTruth, Abc_TtWordNum(nVarsInit)) )
        { if ( pRes ) pRes[0] = '1', pRes[1] = 0; }
    else 
    {
        int Status = Dau_DsdDecomposeInt( p, pTruth, nVarsInit );
        Dau_DsdRemoveBraces( p->pOutput, Dau_DsdComputeMatches(p->pOutput) );
        if ( pRes )
            strcpy( pRes, p->pOutput );
        assert( fSplitPrime || Status != 1 );
        if ( fSplitPrime && Status == 2 )
            return -1;
    }
//    assert( p->nSizeNonDec == 0 );
    return p->nSizeNonDec;
}